

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall AMPLSOption::AMPLSOption(AMPLSOption *this,char *name,char *descr,Option_Type type)

{
  undefined4 in_ECX;
  char *in_RDX;
  char *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  std::__cxx11::string::operator=(in_RDI + 0x20,in_RDX);
  *(undefined4 *)(in_RDI + 0x40) = in_ECX;
  return;
}

Assistant:

AMPLSOption(const char* name, const char* descr, mp::SolverOption::Option_Type type) {
    this->name = name;
    this->description = descr;
    this->type = type;
  }